

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlParserInputBufferPush(xmlParserInputBufferPtr in,int len,char *buf)

{
  ulong len_00;
  int iVar1;
  xmlBufPtr pxVar2;
  size_t nbchars;
  size_t local_28;
  
  local_28 = 0;
  if (len < 0) {
    return 0;
  }
  if (in == (xmlParserInputBufferPtr)0x0) {
    return -1;
  }
  if (in->error != 0) {
    return -1;
  }
  len_00 = (ulong)(uint)len;
  if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
    local_28 = len_00;
    iVar1 = xmlBufAdd(in->buffer,(xmlChar *)buf,len_00);
    if (iVar1 != 0) goto LAB_0015eeb8;
  }
  else {
    if (in->raw == (xmlBufPtr)0x0) {
      pxVar2 = xmlBufCreate(0x32);
      in->raw = pxVar2;
      if (pxVar2 == (xmlBufPtr)0x0) goto LAB_0015eeb8;
    }
    iVar1 = xmlBufAdd(in->raw,(xmlChar *)buf,len_00);
    if (iVar1 != 0) {
LAB_0015eeb8:
      in->error = 2;
      return -1;
    }
    local_28 = 0xffffffffffffffff;
    iVar1 = xmlCharEncInput(in,&local_28);
    if (iVar1 < 0) {
      return -1;
    }
    if (local_28 >> 0x1f != 0) {
      local_28 = 0x7fffffff;
    }
  }
  return (int)local_28;
}

Assistant:

int
xmlParserInputBufferPush(xmlParserInputBufferPtr in,
	                 int len, const char *buf) {
    size_t nbchars = 0;
    int ret;

    if (len < 0) return(0);
    if ((in == NULL) || (in->error)) return(-1);
    if (in->encoder != NULL) {
        /*
	 * Store the data in the incoming raw buffer
	 */
        if (in->raw == NULL) {
	    in->raw = xmlBufCreate(50);
            if (in->raw == NULL) {
                in->error = XML_ERR_NO_MEMORY;
                return(-1);
            }
	}
	ret = xmlBufAdd(in->raw, (const xmlChar *) buf, len);
	if (ret != 0) {
            in->error = XML_ERR_NO_MEMORY;
	    return(-1);
        }

	/*
	 * convert as much as possible to the parser reading buffer.
	 */
        nbchars = SIZE_MAX;
	if (xmlCharEncInput(in, &nbchars) < 0)
            return(-1);
        if (nbchars > INT_MAX)
            nbchars = INT_MAX;
    } else {
	nbchars = len;
        ret = xmlBufAdd(in->buffer, (xmlChar *) buf, nbchars);
	if (ret != 0) {
            in->error = XML_ERR_NO_MEMORY;
	    return(-1);
        }
    }
    return(nbchars);
}